

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareFontTables.cpp
# Opt level: O2

int CompareFsm(int *ec,TestCase *ptcase,GrIStream *grstrmB,GrIStream *grstrmT,int fxdSilfVersionB,
              int fxdSilfVersionT,int iPass)

{
  GrIStream *pGVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  allocator local_462;
  allocator local_461;
  int *local_460;
  TestCase *local_458;
  GrIStream *local_450;
  uint local_448;
  short local_444;
  short local_442;
  GrIStream *local_440;
  int local_434;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_460 = ec;
  local_458 = ptcase;
  iVar3 = (*grstrmB->_vptr_GrIStream[2])(grstrmB);
  iVar4 = (*grstrmT->_vptr_GrIStream[2])(grstrmT);
  if ((short)iVar3 != (short)iVar4) {
    std::__cxx11::string::string((string *)&local_1d0,"ERROR: pass FSM",&local_461);
    std::__cxx11::string::string((string *)&local_1f0," - number of FSM states",&local_462);
    OutputError(local_460,local_458,&local_1d0,iPass,&local_1f0,-1);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1d0);
  }
  iVar3 = (*grstrmB->_vptr_GrIStream[2])(grstrmB);
  iVar4 = (*grstrmT->_vptr_GrIStream[2])(grstrmT);
  if ((short)iVar3 != (short)iVar4) {
    std::__cxx11::string::string((string *)&local_210,"ERROR: pass FSM",&local_461);
    std::__cxx11::string::string
              ((string *)&local_230," - number of FSM transitional states",&local_462);
    OutputError(local_460,local_458,&local_210,iPass,&local_230,-1);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_210);
  }
  iVar4 = (*grstrmB->_vptr_GrIStream[2])(grstrmB);
  iVar5 = (*grstrmT->_vptr_GrIStream[2])(grstrmT);
  if ((short)iVar4 != (short)iVar5) {
    std::__cxx11::string::string((string *)&local_250,"ERROR: pass FSM",&local_461);
    std::__cxx11::string::string((string *)&local_270," - number of FSM success states",&local_462);
    OutputError(local_460,local_458,&local_250,iPass,&local_270,-1);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_250);
  }
  iVar5 = (*grstrmB->_vptr_GrIStream[2])(grstrmB);
  iVar6 = (*grstrmT->_vptr_GrIStream[2])(grstrmT);
  if ((short)iVar5 != (short)iVar6) {
    std::__cxx11::string::string((string *)&local_290,"ERROR: pass FSM",&local_461);
    std::__cxx11::string::string((string *)&local_2b0," - number of FSM columns",&local_462);
    OutputError(local_460,local_458,&local_290,iPass,&local_2b0,-1);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_290);
  }
  uVar7 = (*grstrmB->_vptr_GrIStream[2])(grstrmB);
  iVar6 = (*grstrmT->_vptr_GrIStream[2])(grstrmT);
  if ((short)uVar7 != (short)iVar6) {
    std::__cxx11::string::string((string *)&local_2d0,"ERROR: pass FSM",&local_461);
    std::__cxx11::string::string((string *)&local_2f0," - # of glyph ranges",&local_462);
    OutputError(local_460,local_458,&local_2d0,iPass,&local_2f0,-1);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_2d0);
  }
  local_442 = (short)iVar3;
  iVar3 = (*grstrmB->_vptr_GrIStream[2])(grstrmB);
  iVar6 = (*grstrmT->_vptr_GrIStream[2])(grstrmT);
  if ((short)iVar3 != (short)iVar6) {
    std::__cxx11::string::string((string *)&local_310,"ERROR: pass FSM",&local_461);
    std::__cxx11::string::string((string *)&local_330," - glyph range search increment",&local_462);
    OutputError(local_460,local_458,&local_310,iPass,&local_330,-1);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_310);
  }
  iVar3 = (*grstrmB->_vptr_GrIStream[2])(grstrmB);
  iVar6 = (*grstrmT->_vptr_GrIStream[2])(grstrmT);
  if ((short)iVar3 != (short)iVar6) {
    std::__cxx11::string::string((string *)&local_350,"ERROR: pass FSM",&local_461);
    std::__cxx11::string::string((string *)&local_370," - glyph range search loop",&local_462);
    OutputError(local_460,local_458,&local_350,iPass,&local_370,-1);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_350);
  }
  iVar3 = (*grstrmB->_vptr_GrIStream[2])(grstrmB);
  iVar6 = (*grstrmT->_vptr_GrIStream[2])(grstrmT);
  if ((short)iVar3 != (short)iVar6) {
    std::__cxx11::string::string((string *)&local_390,"ERROR: pass FSM",&local_461);
    std::__cxx11::string::string((string *)&local_3b0," - glyph range search start",&local_462);
    OutputError(local_460,local_458,&local_390,iPass,&local_3b0,-1);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_390);
  }
  uVar9 = 0;
  local_448 = 0;
  if (0 < (short)uVar7) {
    local_448 = uVar7;
  }
  local_448 = local_448 & 0xffff;
  local_450 = grstrmT;
  local_444 = (short)iVar5;
  local_440 = grstrmB;
  local_434 = iVar4;
  for (; pGVar1 = local_440, local_448 != uVar9; uVar9 = uVar9 + 1) {
    iVar3 = (*local_440->_vptr_GrIStream[3])();
    iVar4 = (*local_450->_vptr_GrIStream[3])();
    if ((short)iVar3 != (short)iVar4) {
      std::__cxx11::string::string((string *)&local_50,"ERROR: pass FSM",&local_461);
      std::__cxx11::string::string((string *)&local_70," - glyph range first",&local_462);
      OutputError(local_460,local_458,&local_50,iPass,&local_70,uVar9);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
    }
    iVar3 = (*local_440->_vptr_GrIStream[3])();
    iVar4 = (*local_450->_vptr_GrIStream[3])();
    if ((short)iVar3 != (short)iVar4) {
      std::__cxx11::string::string((string *)&local_90,"ERROR: pass FSM",&local_461);
      std::__cxx11::string::string((string *)&local_b0," - glyph range last",&local_462);
      OutputError(local_460,local_458,&local_90,iPass,&local_b0,uVar9);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
    }
    iVar3 = (*local_440->_vptr_GrIStream[3])();
    iVar4 = (*local_450->_vptr_GrIStream[3])();
    if ((short)iVar3 != (short)iVar4) {
      std::__cxx11::string::string((string *)&local_d0,"ERROR: pass FSM",&local_461);
      std::__cxx11::string::string((string *)&local_f0," - glyph range column",&local_462);
      OutputError(local_460,local_458,&local_d0,iPass,&local_f0,uVar9);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_d0);
    }
  }
  sVar2 = -1;
  if (-1 < (short)local_434) {
    sVar2 = (short)local_434;
  }
  local_448 = sVar2 + 1;
  for (iVar3 = 0; local_448 != iVar3; iVar3 = iVar3 + 1) {
    uVar9 = (*pGVar1->_vptr_GrIStream[3])(pGVar1);
    iVar4 = (*local_450->_vptr_GrIStream[3])();
    if ((short)uVar9 != (short)iVar4) {
      std::__cxx11::string::string((string *)&local_110,"ERROR: pass FSM",&local_461);
      std::__cxx11::string::string((string *)&local_130," - rule map offset",&local_462);
      OutputError(local_460,local_458,&local_110,iPass,&local_130,iVar3);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_110);
    }
    uVar9 = uVar9 & 0xffff;
  }
  for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
    iVar3 = (*pGVar1->_vptr_GrIStream[3])();
    iVar4 = (*local_450->_vptr_GrIStream[3])();
    if ((short)iVar3 != (short)iVar4) {
      std::__cxx11::string::string((string *)&local_150,"ERROR: pass FSM",&local_461);
      std::__cxx11::string::string((string *)&local_170," - rule map item",&local_462);
      OutputError(local_460,local_458,&local_150,iPass,&local_170,uVar7);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_150);
    }
  }
  uVar7 = (*pGVar1->_vptr_GrIStream[1])(pGVar1);
  iVar3 = (*local_450->_vptr_GrIStream[1])();
  if ((char)uVar7 != (char)iVar3) {
    std::__cxx11::string::string((string *)&local_3d0,"ERROR: pass FSM",&local_461);
    std::__cxx11::string::string((string *)&local_3f0," - min rule pre-context",&local_462);
    OutputError(local_460,local_458,&local_3d0,iPass,&local_3f0,uVar9);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::__cxx11::string::~string((string *)&local_3d0);
  }
  uVar8 = (*pGVar1->_vptr_GrIStream[1])(pGVar1);
  iVar3 = (*local_450->_vptr_GrIStream[1])();
  if ((char)uVar8 != (char)iVar3) {
    std::__cxx11::string::string((string *)&local_410,"ERROR: pass FSM",&local_461);
    std::__cxx11::string::string((string *)&local_430," - max rule pre-context",&local_462);
    OutputError(local_460,local_458,&local_410,iPass,&local_430,uVar9);
    std::__cxx11::string::~string((string *)&local_430);
    std::__cxx11::string::~string((string *)&local_410);
  }
  for (iVar3 = 0; iVar3 <= (int)((uVar8 & 0xff) - (uVar7 & 0xff)); iVar3 = iVar3 + 1) {
    iVar4 = (*pGVar1->_vptr_GrIStream[2])(pGVar1);
    iVar5 = (*local_450->_vptr_GrIStream[2])();
    if ((short)iVar4 != (short)iVar5) {
      std::__cxx11::string::string((string *)&local_190,"ERROR: pass FSM",&local_461);
      std::__cxx11::string::string((string *)&local_1b0," - start state",&local_462);
      OutputError(local_460,local_458,&local_190,iPass,&local_1b0,iVar3);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_190);
    }
  }
  return (int)local_442 * (int)local_444;
}

Assistant:

int CompareFsm(int & ec, TestCase * ptcase,
	GrIStream & grstrmB, GrIStream & grstrmT,
	int fxdSilfVersionB, int fxdSilfVersionT, int iPass)
{
	//	number of FSM states
	int crow = grstrmB.ReadShortFromFont();
	if (crow != grstrmT.ReadShortFromFont())
		OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - number of FSM states");
	//	number of transitional states
	int crowTransitional = grstrmB.ReadShortFromFont();
	if (crowTransitional != grstrmT.ReadShortFromFont())
		OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - number of FSM transitional states");
	//	number of success states
	int crowSuccess = grstrmB.ReadShortFromFont();
	if (crowSuccess != grstrmT.ReadShortFromFont())
		OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - number of FSM success states");
	int crowFinal = crow - crowTransitional;
	int crowNonAcpt = crow - crowSuccess;

	//	number of columns
	int ccol = grstrmB.ReadShortFromFont();
	if (ccol != grstrmT.ReadShortFromFont())
		OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - number of FSM columns");

	// Sanity check
	Assert(crowTransitional <= crow && crowSuccess <= crow);

	//	number of FSM glyph ranges and search constants
	int cmcr = grstrmB.ReadShortFromFont();
	if (cmcr != grstrmT.ReadShortFromFont())
		OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - # of glyph ranges");
	if (grstrmB.ReadShortFromFont() != grstrmT.ReadShortFromFont())
		OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - glyph range search increment");
	if (grstrmB.ReadShortFromFont() != grstrmT.ReadShortFromFont())
		OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - glyph range search loop");
	if (grstrmB.ReadShortFromFont() != grstrmT.ReadShortFromFont())
		OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - glyph range search start");

	for (int imcr = 0; imcr < cmcr; imcr++)
	{
		if (grstrmB.ReadUShortFromFont() != grstrmT.ReadUShortFromFont())
			OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - glyph range first", imcr);
		if (grstrmB.ReadUShortFromFont() != grstrmT.ReadUShortFromFont())
			OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - glyph range last", imcr);
		if (grstrmB.ReadUShortFromFont() != grstrmT.ReadUShortFromFont())
			OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - glyph range column", imcr);
	}

	// rule map and offsets (extra item at end gives final offset, ie, total)
	int crulInMap;
	int i;
	for (i = 0; i < (crowSuccess + 1); i++)
	{
		crulInMap = grstrmB.ReadUShortFromFont();	// last offset functions as the total length of the rule list
		if (crulInMap != grstrmT.ReadUShortFromFont())
			OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - rule map offset", i);
	}

	for (i = 0; i < crulInMap; i++)
	{
		if (grstrmB.ReadUShortFromFont() != grstrmT.ReadUShortFromFont())
			OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - rule map item", i);
	}

	//	min rule pre-context number of items
	int critMinRulePreContext = grstrmB.ReadByteFromFont();
	if (critMinRulePreContext != grstrmT.ReadByteFromFont())
		OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - min rule pre-context", i);
	int critMaxRulePreContext = grstrmB.ReadByteFromFont();
	if (critMaxRulePreContext != grstrmT.ReadByteFromFont())
		OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - max rule pre-context", i);

	Assert(critMinRulePreContext <= kMaxSlotsPerRule);
	Assert(critMaxRulePreContext <= kMaxSlotsPerRule);

	int cStartStates = critMaxRulePreContext - critMinRulePreContext + 1;

	//	start states
	for (int ic = 0; ic < cStartStates;	ic++)
	{
		if (grstrmB.ReadShortFromFont() != grstrmT.ReadShortFromFont())
			OutputError(ec, ptcase, "ERROR: pass FSM", iPass, " - start state", ic);
	}

	return (crow - crowFinal) * ccol;
}